

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O3

void __thiscall CircularBuffer<int>::Create(CircularBuffer<int> *this,size_t capacity)

{
  int *piVar1;
  
  if (this->buffer_ != (int *)0x0) {
    operator_delete__(this->buffer_);
  }
  this->size_ = 0;
  this->tail_ = 0;
  this->buffer_ = (int *)0x0;
  this->capacity_ = 0;
  this->head_ = 0;
  piVar1 = (int *)operator_new__(-(ulong)(capacity >> 0x3e != 0) | capacity * 4);
  this->buffer_ = piVar1;
  this->capacity_ = capacity;
  return;
}

Assistant:

void Create(size_t capacity) {
        delete[] buffer_;

        capacity_ = 0;
        size_ = 0;
        tail_ = 0;
        head_ = 0;
        buffer_ = nullptr;

        buffer_ = new T[capacity];
        capacity_ = capacity;
    }